

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_dump(char *filename,int parts,uint64_t nskip,uint64_t nlimit)

{
  mcpl_file_t f;
  char *__ptr;
  
  if (2 < (uint)parts) {
    mcpl_error("mcpl_dump got forbidden value for argument parts");
  }
  f = mcpl_open_file(filename);
  __ptr = mcpl_basename(filename);
  printf("Opened MCPL file %s:\n",__ptr);
  free(__ptr);
  if (parts != 2) {
    mcpl_dump_header(f);
    if (parts != 0) goto LAB_00104b5b;
  }
  mcpl_dump_particles(f,nskip,nlimit,(_func_int_mcpl_particle_t_ptr *)0x0);
LAB_00104b5b:
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)f.internal);
  return;
}

Assistant:

void mcpl_dump(const char * filename, int parts, uint64_t nskip, uint64_t nlimit)
{
  if (parts<0||parts>2)
    mcpl_error("mcpl_dump got forbidden value for argument parts");
  mcpl_file_t f = mcpl_open_file(filename);
  {
    char * bn = mcpl_basename(filename);
    printf("Opened MCPL file %s:\n",bn);
    free(bn);
  }
  if (parts==0||parts==1)
    mcpl_dump_header(f);
  if (parts==0||parts==2)
    mcpl_dump_particles(f,nskip,nlimit,NULL);
  mcpl_close_file(f);
}